

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O3

void EvpathProvideWriterDataToReader
               (CP_Services Svcs,DP_RS_Stream RS_Stream_v,int writerCohortSize,
               CP_PeerCohort PeerCohort,void **providedWriterInfo_v)

{
  long lVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  *(CP_PeerCohort *)((long)RS_Stream_v + 0x48) = PeerCohort;
  *(int *)((long)RS_Stream_v + 0x44) = writerCohortSize;
  pvVar3 = malloc((long)writerCohortSize << 4);
  *(void **)((long)RS_Stream_v + 0x50) = pvVar3;
  if (0 < writerCohortSize) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      pcVar4 = strdup(*providedWriterInfo_v[uVar6]);
      lVar1 = *(long *)((long)RS_Stream_v + 0x50);
      *(char **)(lVar1 + -8 + lVar5) = pcVar4;
      uVar2 = *(undefined8 *)((long)providedWriterInfo_v[uVar6] + 8);
      *(undefined8 *)(lVar1 + lVar5) = uVar2;
      (*Svcs->verbose)(*(void **)((long)RS_Stream_v + 8),5,
                       "Received contact info \"%s\", WS_stream %p for WSR Rank %d\n",pcVar4,uVar2,
                       uVar6 & 0xffffffff);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while ((uint)writerCohortSize != uVar6);
  }
  return;
}

Assistant:

static void EvpathProvideWriterDataToReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v,
                                            int writerCohortSize, CP_PeerCohort PeerCohort,
                                            void **providedWriterInfo_v)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    EvpathWriterContactInfo *providedWriterInfo = (EvpathWriterContactInfo *)providedWriterInfo_v;

    RS_Stream->PeerCohort = PeerCohort;
    RS_Stream->WriterCohortSize = writerCohortSize;

    /*
     * make a copy of writer contact information (original will not be
     * preserved)
     */
    RS_Stream->WriterContactInfo =
        malloc(sizeof(struct _EvpathWriterContactInfo) * writerCohortSize);
    for (int i = 0; i < writerCohortSize; i++)
    {
        RS_Stream->WriterContactInfo[i].ContactString =
            strdup(providedWriterInfo[i]->ContactString);
        RS_Stream->WriterContactInfo[i].WS_Stream = providedWriterInfo[i]->WS_Stream;
        Svcs->verbose(RS_Stream->CP_Stream, DPTraceVerbose,
                      "Received contact info \"%s\", WS_stream %p for WSR Rank %d\n",
                      RS_Stream->WriterContactInfo[i].ContactString,
                      RS_Stream->WriterContactInfo[i].WS_Stream, i);
    }
}